

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_time.cpp
# Opt level: O2

Am_Wrapper * __thiscall Am_Time_Data::Make_Unique(Am_Time_Data *this)

{
  __suseconds_t _Var1;
  Am_Time_Data *pAVar2;
  
  pAVar2 = this;
  if ((this->super_Am_Wrapper).refs != 1) {
    Am_Wrapper::Release(&this->super_Am_Wrapper);
    pAVar2 = (Am_Time_Data *)operator_new(0x20);
    (pAVar2->super_Am_Wrapper).refs = 1;
    (pAVar2->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type =
         (_func_int **)&PTR_ID_002eb7a8;
    _Var1 = (this->time).tv_usec;
    (pAVar2->time).tv_sec = (this->time).tv_sec;
    (pAVar2->time).tv_usec = _Var1;
  }
  return &pAVar2->super_Am_Wrapper;
}

Assistant:

void
Am_Time_Data::Print(std::ostream &os) const
{
  //  os << time.tv_sec <<"s:"<< time.tv_usec << "us";
  os << time.tv_sec * 1000 + time.tv_usec / 1000 << " milliseconds";
}